

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNStmTry::gen_jsr_finally(CTPNStmTry *this)

{
  CTcTokFileDesc *pCVar1;
  long lVar2;
  CTcCodeStream *in_RDI;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  CTcCodeLabel *in_stack_ffffffffffffffe8;
  
  if ((in_RDI->super_CTcDataStream).first_anchor_ != (CTcStreamAnchor *)0x0) {
    CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
    CTcCodeStream::write_ofs2(in_RDI,in_stack_ffffffffffffffe8,0);
    CTcGenTarg::note_push((CTcGenTarg *)0x2df12b);
    CTcGenTarg::note_pop((CTcGenTarg *)0x2df13a);
    pCVar1 = (CTcTokFileDesc *)
             (**(code **)(*(long *)(in_RDI->super_CTcDataStream).page_cnt_ + 0xd0))();
    lVar2 = (**(code **)(*(long *)(in_RDI->super_CTcDataStream).page_cnt_ + 0xd8))();
    CTPNStmBase::add_debug_line_rec((CTPNStmBase *)in_RDI,pCVar1,lVar2);
  }
  return;
}

Assistant:

void CTPNStmTry::gen_jsr_finally()
{
    /* if we have a 'finally', call it */
    if (finally_lbl_ != 0)
    {
        /* generate the local subroutine call */
        G_cg->write_op(OPC_LJSR);
        G_cs->write_ofs2(finally_lbl_, 0);

        /* 
         *   the LJSR pushes a value, which is then immediately popped (we
         *   must note the push and pop because it affects our maximum
         *   stack depth requirement) 
         */
        G_cg->note_push();
        G_cg->note_pop();

        /* 
         *   whatever follows the LJSR is logically at the end of the
         *   'finally' block 
         */
        add_debug_line_rec(finally_stm_->get_end_desc(),
                           finally_stm_->get_end_linenum());
    }
}